

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void testing::internal::PrintCharAndCodeTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  CharFormat CVar1;
  ostream *poVar2;
  int value;
  string local_40;
  
  std::operator<<(os,"L\'");
  CVar1 = PrintAsCharLiteralTo<wchar_t,wchar_t>(c,os);
  std::operator<<(os,"\'");
  if (c != L'\0') {
    poVar2 = std::operator<<(os," (");
    std::ostream::operator<<(poVar2,c);
    if ((9 < (uint)c) && (CVar1 != kHexEscape)) {
      poVar2 = std::operator<<(os,", 0x");
      String::FormatHexInt_abi_cxx11_(&local_40,(String *)(ulong)(uint)c,value);
      std::operator<<(poVar2,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}